

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O3

void __thiscall
StunMsgCxx_BasicBindingRequest_Test::TestBody(StunMsgCxx_BasicBindingRequest_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  stun_attr_hdr *psVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  message message;
  uint8_t tsx_id [12];
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  string local_50;
  base_message<std::allocator<unsigned_char>_> local_30;
  uint8_t local_18 [16];
  
  local_18[0] = 0xfd;
  local_18[1] = 0x95;
  local_18[2] = 0xe8;
  local_18[3] = 0x83;
  local_18[4] = 0x8a;
  local_18[5] = '\x05';
  local_18[6] = '(';
  local_18[7] = 'E';
  local_18[8] = 'j';
  local_18[9] = 0x8e;
  local_18[10] = 0xf1;
  local_18[0xb] = 0xe2;
  stun::base_message<std::allocator<unsigned_char>_>::base_message(&local_30,1,local_18);
  local_68.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014;
  local_70.data_ =
       (AssertHelperData *)
       stun_msg_len((stun_msg_hdr *)
                    local_30.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_50,"sizeof(expected_result)","message.size()",
             (unsigned_long *)&local_68,(unsigned_long *)&local_70);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    anon_unknown.dwarf_24028::IsEqual
              ((anon_unknown_dwarf_24028 *)&local_68,&DAT_0014a310,
               local_30.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0x14);
    if (local_68.ptr_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&local_68,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x5d,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                        (char)local_50._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68.ptr_._0_4_ = 1;
    uVar2 = stun_msg_type((stun_msg_hdr *)
                          local_30.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_70.data_._0_2_ = uVar2;
    testing::internal::
    CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((internal *)&local_50,"stun::message::binding_request","message.type()",
               (type *)&local_68,(unsigned_short *)&local_70);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    psVar3 = stun_msg_next_attr((stun_msg_hdr *)
                                local_30.buffer_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(stun_attr_hdr *)0x0);
    local_68.ptr_._0_1_ = (anon_unknown_dwarf_24028)(psVar3 == (stun_attr_hdr *)0x0);
    local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (psVar3 != (stun_attr_hdr *)0x0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&local_68,(AssertionResult *)"message.end() == i","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,99,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                      (char)local_50._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((stun_msg_hdr *)
      local_30.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stun_msg_hdr *)0x0) {
    operator_delete(local_30.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StunMsgCxx, BasicBindingRequest) {
  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x00, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xfd,0x95,0xe8,0x83, // }
    0x8a,0x05,0x28,0x45, // }  Transaction ID
    0x6a,0x8e,0xf1,0xe2  // }
  };
  
  uint8_t tsx_id[12] = {
    0xfd,0x95,0xe8,0x83,
    0x8a,0x05,0x28,0x45,
    0x6a,0x8e,0xf1,0xe2
  };

  stun::message message(stun::message::binding_request, tsx_id);
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() == i);
}